

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::SVInt>::emplace_back<slang::SVInt&>
          (SmallVectorBase<slang::SVInt> *this,SVInt *args)

{
  iterator pSVar1;
  SVInt *args_local;
  SmallVectorBase<slang::SVInt> *this_local;
  
  if (this->len == this->cap) {
    pSVar1 = end(this);
    this_local = (SmallVectorBase<slang::SVInt> *)emplaceRealloc<slang::SVInt&>(this,pSVar1,args);
  }
  else {
    pSVar1 = end(this);
    SVInt::SVInt(pSVar1,args);
    this->len = this->len + 1;
    this_local = (SmallVectorBase<slang::SVInt> *)back(this);
  }
  return (reference)this_local;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }